

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

uv_handle_type uv_pipe_pending_type(uv_pipe_t *handle)

{
  int iVar1;
  int iVar2;
  int aiStack_a4 [3];
  sockaddr sStack_98;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  if ((handle->ipc == 0) || (iVar2 = handle->accepted_fd, iVar2 == -1)) {
    return UV_UNKNOWN_HANDLE;
  }
  sStack_98.sa_family = 0;
  sStack_98.sa_data[0] = '\0';
  sStack_98.sa_data[1] = '\0';
  sStack_98.sa_data[2] = '\0';
  sStack_98.sa_data[3] = '\0';
  sStack_98.sa_data[4] = '\0';
  sStack_98.sa_data[5] = '\0';
  sStack_98.sa_data[6] = '\0';
  sStack_98.sa_data[7] = '\0';
  sStack_98.sa_data[8] = '\0';
  sStack_98.sa_data[9] = '\0';
  sStack_98.sa_data[10] = '\0';
  sStack_98.sa_data[0xb] = '\0';
  sStack_98.sa_data[0xc] = '\0';
  sStack_98.sa_data[0xd] = '\0';
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  aiStack_a4[2] = 0x80;
  iVar1 = getsockname(iVar2,&sStack_98,(socklen_t *)(aiStack_a4 + 2));
  if (iVar1 == 0) {
    aiStack_a4[1] = 4;
    iVar2 = getsockopt(iVar2,1,3,aiStack_a4,(socklen_t *)(aiStack_a4 + 1));
    if (iVar2 == 0) {
      if (aiStack_a4[0] == 2) {
        if ((sStack_98.sa_family & 0xfff7) == 2) {
          return UV_UDP;
        }
      }
      else if (aiStack_a4[0] == 1) {
        if (sStack_98.sa_family == 1) {
          return UV_NAMED_PIPE;
        }
        if ((sStack_98.sa_family == 10) || (sStack_98.sa_family == 2)) {
          return UV_TCP;
        }
      }
    }
  }
  return UV_UNKNOWN_HANDLE;
}

Assistant:

uv_handle_type uv_pipe_pending_type(uv_pipe_t* handle) {
  if (!handle->ipc)
    return UV_UNKNOWN_HANDLE;

  if (handle->accepted_fd == -1)
    return UV_UNKNOWN_HANDLE;
  else
    return uv__handle_type(handle->accepted_fd);
}